

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall
section_data::slice_horiz_angled(section_data *this,int *line_start,int *line_end,int *layer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  intercept_data intercept;
  double dVar4;
  double dVar5;
  double distance;
  double x_intercept;
  double m;
  double c;
  intercept_data tempy;
  double ya;
  double xb;
  double xa;
  int *layer_local;
  int *line_end_local;
  int *line_start_local;
  section_data *this_local;
  
  iVar1 = *line_start;
  iVar2 = *line_end;
  iVar3 = line_start[1];
  dVar4 = round(((double)iVar3 -
                ((double)this->y1 +
                ((double)this->x1 * (double)this->y1 + -((double)this->x1 * (double)this->y2)) /
                ((double)this->x2 - (double)this->x1))) /
                (((double)this->y2 - (double)this->y1) / ((double)this->x2 - (double)this->x1)));
  if (((double)iVar1 <= dVar4) && (dVar4 <= (double)iVar2)) {
    dVar5 = sqrt((dVar4 - (double)this->x1) * (dVar4 - (double)this->x1) +
                 (double)((line_start[1] - this->y1) * (line_start[1] - this->y1)));
    dVar5 = round(dVar5);
    intercept.y = (int)(double)iVar3;
    intercept.x = (int)dVar4;
    intercept.dist = (int)dVar5;
    push_intercept(this,layer,intercept);
  }
  return 0;
}

Assistant:

int section_data::slice_horiz_angled(int line_start[2], int line_end[2],
                                     int &layer)
{
  double xa = (double)line_start[0];
  double xb = (double)line_end[0];
  double ya = (double)line_start[1];
  intercept_data tempy;
  // Solve linear equation
  double c =
      (double)y1 + (((double)x1 * (double)y1) - ((double)x1 * (double)y2)) /
                       ((double)x2 - (double)x1);
  double m = (((double)y2 - (double)y1) / ((double)x2 - (double)x1));
  // y = mx + c    -    Solve for x using y value of horizontal line
  // x = (ya-c)/m  -    Does x lie within boundary of [xa,xb]
  double x_intercept = round(((double)ya - c) / m);
  // if it does, calculate the distance from x1 [x1 always origin, x1 always LE
  // x2]
  if ((x_intercept >= xa) && (x_intercept <= xb)) {
    double distance = round(sqrt((x_intercept - x1) * (x_intercept - x1) +
                                 (line_start[1] - y1) * (line_start[1] - y1)));
    tempy.x = (int)x_intercept;
    tempy.y = (int)ya;
    tempy.dist = (int)distance;
    push_intercept(layer, tempy); // round to nearest database unit (nm)
  }
  return EXIT_SUCCESS;
}